

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O3

void double_conversion::GenerateCountedDigits
               (int count,int *decimal_point,Bignum *numerator,Bignum *denominator,
               Vector<char> buffer,int *length)

{
  uint uVar1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char cVar6;
  char *pcVar7;
  ulong uVar8;
  
  pcVar7 = buffer.start_;
  uVar1 = count - 1;
  uVar5 = (ulong)uVar1;
  if (count < 2) {
    uVar2 = Bignum::DivideModuloIntBignum(numerator,denominator);
    iVar3 = Bignum::PlusCompare(numerator,numerator,denominator);
    pcVar7[(int)uVar1] = (-1 < iVar3) + (char)uVar2 + '0';
  }
  else {
    uVar8 = 0;
    do {
      uVar2 = Bignum::DivideModuloIntBignum(numerator,denominator);
      pcVar7[uVar8] = (char)uVar2 + '0';
      Bignum::MultiplyByUInt32(numerator,10);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
    uVar2 = Bignum::DivideModuloIntBignum(numerator,denominator);
    iVar3 = Bignum::PlusCompare(numerator,numerator,denominator);
    pcVar7[(int)uVar1] = (-1 < iVar3) + (char)uVar2 + '0';
    if (1 < count) {
      cVar6 = pcVar7[uVar5];
      pcVar4 = pcVar7;
      iVar3 = count;
      do {
        if (cVar6 != ':') break;
        pcVar4[uVar5] = '0';
        cVar6 = pcVar4[count - 2U] + '\x01';
        pcVar4[count - 2U] = cVar6;
        iVar3 = iVar3 + -1;
        pcVar4 = pcVar4 + -1;
      } while (1 < iVar3);
    }
  }
  if (*pcVar7 == ':') {
    *pcVar7 = '1';
    *decimal_point = *decimal_point + 1;
  }
  *buffer._8_8_ = count;
  return;
}

Assistant:

static void GenerateCountedDigits(int count, int* decimal_point,
                                  Bignum* numerator, Bignum* denominator,
                                  Vector<char> buffer, int* length) {
  DOUBLE_CONVERSION_ASSERT(count >= 0);
  for (int i = 0; i < count - 1; ++i) {
    uint16_t digit;
    digit = numerator->DivideModuloIntBignum(*denominator);
    DOUBLE_CONVERSION_ASSERT(digit <= 9);  // digit is a uint16_t and therefore always positive.
    // digit = numerator / denominator (integer division).
    // numerator = numerator % denominator.
    buffer[i] = static_cast<char>(digit + '0');
    // Prepare for next iteration.
    numerator->Times10();
  }
  // Generate the last digit.
  uint16_t digit;
  digit = numerator->DivideModuloIntBignum(*denominator);
  if (Bignum::PlusCompare(*numerator, *numerator, *denominator) >= 0) {
    digit++;
  }
  DOUBLE_CONVERSION_ASSERT(digit <= 10);
  buffer[count - 1] = static_cast<char>(digit + '0');
  // Correct bad digits (in case we had a sequence of '9's). Propagate the
  // carry until we hat a non-'9' or til we reach the first digit.
  for (int i = count - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) break;
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  if (buffer[0] == '0' + 10) {
    // Propagate a carry past the top place.
    buffer[0] = '1';
    (*decimal_point)++;
  }
  *length = count;
}